

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O0

void __thiscall BPlusTree::PrintRecordsInNode(BPlusTree *this,shared_ptr<Node> *node)

{
  ulong uVar1;
  element_type *peVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  shared_ptr<void> local_30;
  int local_1c;
  shared_ptr<Node> *psStack_18;
  int i;
  shared_ptr<Node> *node_local;
  BPlusTree *this_local;
  
  local_1c = 0;
  psStack_18 = node;
  node_local = &this->root;
  while( true ) {
    uVar1 = (ulong)local_1c;
    peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node)
    ;
    sVar3 = std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::size
                      (&peVar2->ptrs);
    if (sVar3 <= uVar1) break;
    peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node)
    ;
    pvVar4 = std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::operator[]
                       (&peVar2->ptrs,(long)local_1c);
    std::shared_ptr<void>::shared_ptr(&local_30,pvVar4);
    peVar2 = std::__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)node)
    ;
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](&peVar2->keys,(long)local_1c);
    PrintRecordOfKey(this,&local_30,*pvVar5);
    std::shared_ptr<void>::~shared_ptr(&local_30);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void BPlusTree::PrintRecordsInNode(std::shared_ptr<Node> node) {
    for (int i = 0; i < node->ptrs.size(); i++) {
        PrintRecordOfKey(node->ptrs[i], node->keys[i]);
    }
}